

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O1

TPM_RC TPM2_HMAC(TSS_DEVICE *tpm,TSS_SESSION *session,TPMI_DH_OBJECT handle,TPM2B_MAX_BUFFER *buffer
                ,TPMI_ALG_HASH hashAlg,TPM2B_DIGEST *outHMAC)

{
  UINT16 UVar1;
  TPM_RC TVar2;
  TPM_RC TVar3;
  LOGGER_LOG p_Var4;
  TPMI_ALG_HASH hashAlg_local;
  TPMI_DH_OBJECT handle_local;
  TSS_SESSION *session_local;
  INT32 sizeParamBuf;
  BYTE *paramBuf;
  TSS_CMD_CONTEXT CmdCtx;
  
  hashAlg_local = hashAlg;
  handle_local = handle;
  session_local = session;
  if ((buffer == (TPM2B_MAX_BUFFER *)0x0 ||
      (session == (TSS_SESSION *)0x0 || tpm == (TSS_DEVICE *)0x0)) || outHMAC == (TPM2B_DIGEST *)0x0
     ) {
    p_Var4 = xlogging_get_log_function();
    TVar2 = 0x101;
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_codec.c"
                ,"TPM2_HMAC",0x194,1,
                "Invalid parameter specified tpm: %p, session: %p, buffer: %p, outHMAC: %p",tpm,
                session_local,buffer,outHMAC);
    }
  }
  else {
    sizeParamBuf = 0x1000;
    paramBuf = CmdCtx.ParamBuffer;
    CmdCtx.ParamSize = 0;
    UVar1 = TPM2B_MAX_BUFFER_Marshal(buffer,&paramBuf,&sizeParamBuf);
    CmdCtx.ParamSize = CmdCtx.ParamSize + UVar1;
    UVar1 = UINT16_Marshal(&hashAlg_local,&paramBuf,&sizeParamBuf);
    CmdCtx.ParamSize = CmdCtx.ParamSize + UVar1;
    TVar2 = TSS_DispatchCmd(tpm,0x155,&handle_local,1,&session_local,1,&CmdCtx);
    if (TVar2 == 0) {
      TVar3 = TPM2B_DIGEST_Unmarshal(outHMAC,&CmdCtx.RespBufPtr,(INT32 *)&CmdCtx.RespBytesLeft);
      TVar2 = 0x9a;
      if (TVar3 == 0) {
        TVar2 = 0;
      }
    }
  }
  return TVar2;
}

Assistant:

TPM_RC TPM2_HMAC(
    TSS_DEVICE             *tpm,                // IN/OUT
    TSS_SESSION            *session,            // IN/OUT
    TPMI_DH_OBJECT          handle,             // IN
    TPM2B_MAX_BUFFER       *buffer,             // IN
    TPMI_ALG_HASH           hashAlg,            // IN
    TPM2B_DIGEST           *outHMAC             // OUT
)
{
    TSS_CMD_CONTEXT  CmdCtx;
    TPM_RC result;
    if (tpm == NULL || session == NULL || buffer == NULL || outHMAC == NULL)
    {
        LogError("Invalid parameter specified tpm: %p, session: %p, buffer: %p, outHMAC: %p", tpm, session, buffer, outHMAC);
        result = TPM_RC_FAILURE;
    }
    else
    {
        result = TPM_RC_SUCCESS;
        BEGIN_CMD();
        TSS_MARSHAL_OPT2B(TPM2B_MAX_BUFFER, buffer);
        TSS_MARSHAL(TPMI_ALG_HASH, &hashAlg);
        DISPATCH_CMD(HMAC, &handle, 1, &session, 1);
        TSS_UNMARSHAL(TPM2B_DIGEST, outHMAC);
        END_CMD();
    }
    return result;
}